

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O3

int AF_A_PhoenixPuff(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  double dVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  PClassActor *pPVar6;
  AActor *pAVar7;
  undefined8 *puVar8;
  char *__assertion;
  bool bVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  FName local_5c;
  undefined1 local_58 [16];
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005cdc69;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar8 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar8 == (undefined8 *)0x0) {
LAB_005cda1b:
        puVar8 = (undefined8 *)0x0;
      }
      else {
        pPVar5 = (PClass *)puVar8[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar8)(puVar8);
          puVar8[1] = pPVar5;
        }
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar4 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar4) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cdc69;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005cdadb;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005cdc59;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar4 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar4) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005cdc69;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005cdc59;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005cdadb:
        local_5c.Index = FName::NameManager::FindName(&FName::NameData,"PhoenixPuff",false);
        local_48.X = (double)puVar8[9];
        local_48.Y = (double)puVar8[10];
        local_48.Z = (double)puVar8[0xb];
        pPVar6 = ClassForSpawn(&local_5c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        dVar3 = FFastTrig::cos(&fasttrig,
                               ((double)puVar8[0x12] + 90.0) * 11930464.711111112 +
                               6755399441055744.0);
        local_58._8_4_ = extraout_XMM0_Dc;
        local_58._0_8_ = dVar3;
        local_58._12_4_ = extraout_XMM0_Dd;
        dVar3 = FFastTrig::sin(&fasttrig,dVar3);
        (pAVar7->Vel).Z = 0.0;
        (pAVar7->Vel).X = (double)local_58._0_8_ * 1.3;
        (pAVar7->Vel).Y = dVar3 * 1.3;
        local_5c.Index = FName::NameManager::FindName(&FName::NameData,"PhoenixPuff",false);
        local_48.X = (double)puVar8[9];
        local_48.Y = (double)puVar8[10];
        local_48.Z = (double)puVar8[0xb];
        pPVar6 = ClassForSpawn(&local_5c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        dVar3 = FFastTrig::cos(&fasttrig,
                               ((double)puVar8[0x12] + -90.0) * 11930464.711111112 +
                               6755399441055744.0);
        local_58._8_4_ = extraout_XMM0_Dc_00;
        local_58._0_8_ = dVar3;
        local_58._12_4_ = extraout_XMM0_Dd_00;
        dVar3 = FFastTrig::sin(&fasttrig,dVar3);
        (pAVar7->Vel).Z = 0.0;
        (pAVar7->Vel).X = (double)local_58._0_8_ * 1.3;
        (pAVar7->Vel).Y = dVar3 * 1.3;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005cdc69;
    }
    if (puVar8 == (undefined8 *)0x0) goto LAB_005cda1b;
  }
LAB_005cdc59:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005cdc69:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PhoenixPuff)
{
	PARAM_ACTION_PROLOGUE;

	AActor *puff;
	DAngle angle;

	//[RH] Heretic never sets the target for seeking
	//P_SeekerMissile (self, 5, 10);
	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw + 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);

	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw - 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);
	return 0;
}